

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void attachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  Btree **ppBtree;
  uint uVar1;
  sqlite3 *db;
  Db *pDVar2;
  Btree *pBVar3;
  char *pcVar4;
  Btree *pBVar5;
  Schema *pSVar6;
  u8 uVar7;
  undefined6 uVar8;
  u8 uVar9;
  u8 uVar10;
  undefined6 uVar11;
  sqlite3_context *pCtx;
  int iVar12;
  int iVar13;
  uchar *puVar14;
  uchar *z;
  Db *pDVar15;
  Schema *pSVar16;
  char *pcVar17;
  ulong uVar18;
  long lVar19;
  char *zErrDyn;
  sqlite3_context *local_60;
  uint flags;
  uchar *local_50;
  char *zErr;
  char *zPath;
  sqlite3_vfs *pVfs;
  
  db = context->pOut->db;
  zPath = (char *)0x0;
  zErr = (char *)0x0;
  zErrDyn = (char *)0x0;
  puVar14 = sqlite3_value_text(*argv);
  z = sqlite3_value_text(argv[1]);
  if (puVar14 == (uchar *)0x0) {
    puVar14 = "";
  }
  if (z == (uchar *)0x0) {
    z = "";
  }
  uVar1 = db->nDb;
  if ((int)uVar1 < db->aLimit[7] + 2) {
    if (db->autoCommit == '\0') {
      iVar12 = 0;
      zErrDyn = sqlite3MPrintf(db,"cannot ATTACH database within transaction");
    }
    else {
      uVar18 = 0;
      if (0 < (int)uVar1) {
        uVar18 = (ulong)uVar1;
      }
      pDVar15 = db->aDb;
      lVar19 = 0;
      local_60 = context;
      local_50 = puVar14;
      do {
        if (uVar18 * 0x20 + 0x20 == lVar19 + 0x20) {
          if (pDVar15 == db->aDbStatic) {
            pDVar15 = (Db *)sqlite3DbMallocRawNN(db,0x60);
            if (pDVar15 == (Db *)0x0) {
              return;
            }
            pDVar2 = db->aDb;
            pcVar17 = pDVar2->zDbSName;
            pBVar3 = pDVar2->pBt;
            uVar9 = pDVar2->safety_level;
            uVar10 = pDVar2->bSyncSet;
            uVar11 = *(undefined6 *)&pDVar2->field_0x12;
            pSVar16 = pDVar2->pSchema;
            pcVar4 = pDVar2[1].zDbSName;
            pBVar5 = pDVar2[1].pBt;
            uVar7 = pDVar2[1].bSyncSet;
            uVar8 = *(undefined6 *)&pDVar2[1].field_0x12;
            pSVar6 = pDVar2[1].pSchema;
            pDVar15[1].safety_level = pDVar2[1].safety_level;
            pDVar15[1].bSyncSet = uVar7;
            *(undefined6 *)&pDVar15[1].field_0x12 = uVar8;
            pDVar15[1].pSchema = pSVar6;
            pDVar15[1].zDbSName = pcVar4;
            pDVar15[1].pBt = pBVar5;
            pDVar15->safety_level = uVar9;
            pDVar15->bSyncSet = uVar10;
            *(undefined6 *)&pDVar15->field_0x12 = uVar11;
            pDVar15->pSchema = pSVar16;
            pDVar15->zDbSName = pcVar17;
            pDVar15->pBt = pBVar3;
          }
          else {
            pDVar15 = (Db *)sqlite3DbRealloc(db,pDVar15,(long)(int)uVar1 * 0x20 + 0x20);
            if (pDVar15 == (Db *)0x0) {
              return;
            }
          }
          pCtx = local_60;
          db->aDb = pDVar15;
          iVar12 = db->nDb;
          pDVar2 = pDVar15 + iVar12;
          pDVar2->safety_level = '\0';
          pDVar2->bSyncSet = '\0';
          *(undefined6 *)&pDVar2->field_0x12 = 0;
          *(Schema **)(&pDVar2->safety_level + 8) = (Schema *)0x0;
          pDVar15[iVar12].zDbSName = (char *)0x0;
          pDVar15[iVar12].pBt = (Btree *)0x0;
          flags = db->openFlags;
          iVar13 = sqlite3ParseUri(db->pVfs->zName,(char *)local_50,&flags,&pVfs,&zPath,&zErr);
          pcVar17 = zPath;
          if (iVar13 != 0) {
            if (iVar13 == 7) {
              sqlite3OomFault(db);
            }
            pcVar17 = zErr;
            sqlite3_result_error(pCtx,zErr,-1);
            sqlite3_free(pcVar17);
            return;
          }
          pDVar15 = pDVar15 + iVar12;
          flags = flags | 0x100;
          ppBtree = &pDVar15->pBt;
          iVar13 = sqlite3BtreeOpen(pVfs,zPath,db,ppBtree,0,flags);
          sqlite3_free(pcVar17);
          db->nDb = db->nDb + 1;
          db->skipBtreeMutex = '\0';
          if (iVar13 == 0) {
            pSVar16 = sqlite3SchemaGet(db,pDVar15->pBt);
            pDVar15->pSchema = pSVar16;
            iVar13 = 7;
            if (((pSVar16 != (Schema *)0x0) && (iVar13 = 0, pSVar16->file_format != '\0')) &&
               (pSVar16->enc != db->enc)) {
              zErrDyn = sqlite3MPrintf(db,
                                       "attached databases must use the same text encoding as main database"
                                      );
              iVar13 = 1;
            }
            sqlite3BtreeEnter(*ppBtree);
            sqlite3PagerLockingMode((*ppBtree)->pBt->pPager,(uint)db->dfltLockMode);
            pBVar3 = *ppBtree;
            iVar12 = sqlite3BtreeSecureDelete(db->aDb->pBt,-1);
            sqlite3BtreeSecureDelete(pBVar3,iVar12);
            sqlite3BtreeSetPagerFlags(*ppBtree,db->flags & 0x38U | 3);
            sqlite3BtreeLeave(*ppBtree);
          }
          else if (iVar13 == 0x13) {
            zErrDyn = sqlite3MPrintf(db,"database is already attached");
            iVar13 = 1;
          }
          pDVar15->safety_level = '\x03';
          pcVar17 = sqlite3DbStrDup(db,(char *)z);
          pDVar15->zDbSName = pcVar17;
          iVar12 = 0;
          if (pcVar17 == (char *)0x0) {
            iVar12 = 7;
          }
          if (iVar13 != 0) {
            iVar12 = iVar13;
          }
          if (iVar12 == 0) {
            sqlite3BtreeEnterAll(db);
            iVar12 = sqlite3Init(db,&zErrDyn);
            sqlite3BtreeLeaveAll(db);
            if (iVar12 == 0) {
              return;
            }
          }
          lVar19 = (long)db->nDb + -1;
          pBVar3 = db->aDb[lVar19].pBt;
          if (pBVar3 != (Btree *)0x0) {
            sqlite3BtreeClose(pBVar3);
            pDVar15 = db->aDb;
            pDVar15[lVar19].pBt = (Btree *)0x0;
            pDVar15[lVar19].pSchema = (Schema *)0x0;
          }
          sqlite3ResetAllSchemasOfConnection(db);
          context = local_60;
          db->nDb = (int)lVar19;
          if ((iVar12 == 0xc0a) || (iVar12 == 7)) {
            sqlite3OomFault(db);
            sqlite3DbFree(db,zErrDyn);
            zErrDyn = sqlite3MPrintf(db,"out of memory");
            context = local_60;
          }
          else {
            if (zErrDyn != (char *)0x0) goto LAB_0016da13;
            zErrDyn = sqlite3MPrintf(db,"unable to open database: %s",local_50);
          }
          goto LAB_0016da0e;
        }
        iVar12 = sqlite3StrICmp(*(char **)((long)&pDVar15->zDbSName + lVar19),(char *)z);
        lVar19 = lVar19 + 0x20;
      } while (iVar12 != 0);
      iVar12 = 0;
      zErrDyn = sqlite3MPrintf(db,"database %s is already in use",z);
      context = local_60;
    }
  }
  else {
    iVar12 = 0;
    zErrDyn = sqlite3MPrintf(db,"too many attached databases - max %d");
  }
LAB_0016da0e:
  if (zErrDyn != (char *)0x0) {
LAB_0016da13:
    sqlite3_result_error(context,zErrDyn,-1);
    sqlite3DbFree(db,zErrDyn);
  }
  if (iVar12 != 0) {
    sqlite3_result_error_code(context,iVar12);
  }
  return;
}

Assistant:

static void attachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  int i;
  int rc = 0;
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zName;
  const char *zFile;
  char *zPath = 0;
  char *zErr = 0;
  unsigned int flags;
  Db *aNew;                 /* New array of Db pointers */
  Db *pNew;                 /* Db object for the newly attached database */
  char *zErrDyn = 0;
  sqlite3_vfs *pVfs;

  UNUSED_PARAMETER(NotUsed);

  zFile = (const char *)sqlite3_value_text(argv[0]);
  zName = (const char *)sqlite3_value_text(argv[1]);
  if( zFile==0 ) zFile = "";
  if( zName==0 ) zName = "";

  /* Check for the following errors:
  **
  **     * Too many attached databases,
  **     * Transaction currently open
  **     * Specified database name already being used.
  */
  if( db->nDb>=db->aLimit[SQLITE_LIMIT_ATTACHED]+2 ){
    zErrDyn = sqlite3MPrintf(db, "too many attached databases - max %d", 
      db->aLimit[SQLITE_LIMIT_ATTACHED]
    );
    goto attach_error;
  }
  if( !db->autoCommit ){
    zErrDyn = sqlite3MPrintf(db, "cannot ATTACH database within transaction");
    goto attach_error;
  }
  for(i=0; i<db->nDb; i++){
    char *z = db->aDb[i].zDbSName;
    assert( z && zName );
    if( sqlite3StrICmp(z, zName)==0 ){
      zErrDyn = sqlite3MPrintf(db, "database %s is already in use", zName);
      goto attach_error;
    }
  }

  /* Allocate the new entry in the db->aDb[] array and initialize the schema
  ** hash tables.
  */
  if( db->aDb==db->aDbStatic ){
    aNew = sqlite3DbMallocRawNN(db, sizeof(db->aDb[0])*3 );
    if( aNew==0 ) return;
    memcpy(aNew, db->aDb, sizeof(db->aDb[0])*2);
  }else{
    aNew = sqlite3DbRealloc(db, db->aDb, sizeof(db->aDb[0])*(db->nDb+1) );
    if( aNew==0 ) return;
  }
  db->aDb = aNew;
  pNew = &db->aDb[db->nDb];
  memset(pNew, 0, sizeof(*pNew));

  /* Open the database file. If the btree is successfully opened, use
  ** it to obtain the database schema. At this point the schema may
  ** or may not be initialized.
  */
  flags = db->openFlags;
  rc = sqlite3ParseUri(db->pVfs->zName, zFile, &flags, &pVfs, &zPath, &zErr);
  if( rc!=SQLITE_OK ){
    if( rc==SQLITE_NOMEM ) sqlite3OomFault(db);
    sqlite3_result_error(context, zErr, -1);
    sqlite3_free(zErr);
    return;
  }
  assert( pVfs );
  flags |= SQLITE_OPEN_MAIN_DB;
  rc = sqlite3BtreeOpen(pVfs, zPath, db, &pNew->pBt, 0, flags);
  sqlite3_free( zPath );
  db->nDb++;
  db->skipBtreeMutex = 0;
  if( rc==SQLITE_CONSTRAINT ){
    rc = SQLITE_ERROR;
    zErrDyn = sqlite3MPrintf(db, "database is already attached");
  }else if( rc==SQLITE_OK ){
    Pager *pPager;
    pNew->pSchema = sqlite3SchemaGet(db, pNew->pBt);
    if( !pNew->pSchema ){
      rc = SQLITE_NOMEM_BKPT;
    }else if( pNew->pSchema->file_format && pNew->pSchema->enc!=ENC(db) ){
      zErrDyn = sqlite3MPrintf(db, 
        "attached databases must use the same text encoding as main database");
      rc = SQLITE_ERROR;
    }
    sqlite3BtreeEnter(pNew->pBt);
    pPager = sqlite3BtreePager(pNew->pBt);
    sqlite3PagerLockingMode(pPager, db->dfltLockMode);
    sqlite3BtreeSecureDelete(pNew->pBt,
                             sqlite3BtreeSecureDelete(db->aDb[0].pBt,-1) );
#ifndef SQLITE_OMIT_PAGER_PRAGMAS
    sqlite3BtreeSetPagerFlags(pNew->pBt,
                      PAGER_SYNCHRONOUS_FULL | (db->flags & PAGER_FLAGS_MASK));
#endif
    sqlite3BtreeLeave(pNew->pBt);
  }
  pNew->safety_level = SQLITE_DEFAULT_SYNCHRONOUS+1;
  pNew->zDbSName = sqlite3DbStrDup(db, zName);
  if( rc==SQLITE_OK && pNew->zDbSName==0 ){
    rc = SQLITE_NOMEM_BKPT;
  }


#ifdef SQLITE_HAS_CODEC
  if( rc==SQLITE_OK ){
    extern int sqlite3CodecAttach(sqlite3*, int, const void*, int);
    extern void sqlite3CodecGetKey(sqlite3*, int, void**, int*);
    int nKey;
    char *zKey;
    int t = sqlite3_value_type(argv[2]);
    switch( t ){
      case SQLITE_INTEGER:
      case SQLITE_FLOAT:
        zErrDyn = sqlite3DbStrDup(db, "Invalid key value");
        rc = SQLITE_ERROR;
        break;
        
      case SQLITE_TEXT:
      case SQLITE_BLOB:
        nKey = sqlite3_value_bytes(argv[2]);
        zKey = (char *)sqlite3_value_blob(argv[2]);
        rc = sqlite3CodecAttach(db, db->nDb-1, zKey, nKey);
        break;

      case SQLITE_NULL:
        /* No key specified.  Use the key from the main database */
        sqlite3CodecGetKey(db, 0, (void**)&zKey, &nKey);
        if( nKey || sqlite3BtreeGetOptimalReserve(db->aDb[0].pBt)>0 ){
          rc = sqlite3CodecAttach(db, db->nDb-1, zKey, nKey);
        }
        break;
    }
  }
#endif

  /* If the file was opened successfully, read the schema for the new database.
  ** If this fails, or if opening the file failed, then close the file and 
  ** remove the entry from the db->aDb[] array. i.e. put everything back the way
  ** we found it.
  */
  if( rc==SQLITE_OK ){
    sqlite3BtreeEnterAll(db);
    rc = sqlite3Init(db, &zErrDyn);
    sqlite3BtreeLeaveAll(db);
  }
#ifdef SQLITE_USER_AUTHENTICATION
  if( rc==SQLITE_OK ){
    u8 newAuth = 0;
    rc = sqlite3UserAuthCheckLogin(db, zName, &newAuth);
    if( newAuth<db->auth.authLevel ){
      rc = SQLITE_AUTH_USER;
    }
  }
#endif
  if( rc ){
    int iDb = db->nDb - 1;
    assert( iDb>=2 );
    if( db->aDb[iDb].pBt ){
      sqlite3BtreeClose(db->aDb[iDb].pBt);
      db->aDb[iDb].pBt = 0;
      db->aDb[iDb].pSchema = 0;
    }
    sqlite3ResetAllSchemasOfConnection(db);
    db->nDb = iDb;
    if( rc==SQLITE_NOMEM || rc==SQLITE_IOERR_NOMEM ){
      sqlite3OomFault(db);
      sqlite3DbFree(db, zErrDyn);
      zErrDyn = sqlite3MPrintf(db, "out of memory");
    }else if( zErrDyn==0 ){
      zErrDyn = sqlite3MPrintf(db, "unable to open database: %s", zFile);
    }
    goto attach_error;
  }
  
  return;

attach_error:
  /* Return an error if we get here */
  if( zErrDyn ){
    sqlite3_result_error(context, zErrDyn, -1);
    sqlite3DbFree(db, zErrDyn);
  }
  if( rc ) sqlite3_result_error_code(context, rc);
}